

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_Jinx::Variant_&,_const_int_&> * __thiscall
Catch::ExprLhs<Jinx::Variant_const&>::operator<
          (BinaryExpr<const_Jinx::Variant_&,_const_int_&> *__return_storage_ptr__,
          ExprLhs<Jinx::Variant_const&> *this,int *rhs)

{
  Variant *pVVar1;
  bool comparisonResult;
  StringRef local_68 [2];
  Variant local_48;
  int *local_20;
  int *rhs_local;
  ExprLhs<const_Jinx::Variant_&> *this_local;
  
  pVVar1 = *(Variant **)this;
  local_20 = rhs;
  rhs_local = (int *)this;
  this_local = (ExprLhs<const_Jinx::Variant_&> *)__return_storage_ptr__;
  Jinx::Variant::Variant(&local_48,*rhs);
  comparisonResult = Jinx::operator<(pVVar1,&local_48);
  pVVar1 = *(Variant **)this;
  StringRef::StringRef(local_68,"<");
  BinaryExpr<const_Jinx::Variant_&,_const_int_&>::BinaryExpr
            (__return_storage_ptr__,comparisonResult,pVVar1,local_68[0],local_20);
  Jinx::Variant::~Variant(&local_48);
  return __return_storage_ptr__;
}

Assistant:

auto operator < ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { static_cast<bool>(m_lhs < rhs), m_lhs, "<", rhs };
        }